

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O3

void CSOAA::subtract_example(vw *all,example *ec,example *ecsub)

{
  (ec->super_example_predict).feature_space[0x7e].sum_feat_sq = 0.0;
  GD::foreach_feature<example_&,_unsigned_long,_&CSOAA::subtract_feature>(all,ecsub,ec);
  v_array<unsigned_char>::push_back((v_array<unsigned_char> *)ec,"~malformed cost specification: ");
  ec->num_features =
       ec->num_features +
       ((long)(ec->super_example_predict).feature_space[0x7e].values._end -
        (long)(ec->super_example_predict).feature_space[0x7e].values._begin >> 2);
  ec->total_sum_feat_sq =
       (ec->super_example_predict).feature_space[0x7e].sum_feat_sq + ec->total_sum_feat_sq;
  return;
}

Assistant:

void subtract_example(vw& all, example* ec, example* ecsub)
{
  features& wap_fs = ec->feature_space[wap_ldf_namespace];
  wap_fs.sum_feat_sq = 0;
  GD::foreach_feature<example&, uint64_t, subtract_feature>(all, *ecsub, *ec);
  ec->indices.push_back(wap_ldf_namespace);
  ec->num_features += wap_fs.size();
  ec->total_sum_feat_sq += wap_fs.sum_feat_sq;
}